

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

int ar_equation_system_solve(aom_noise_state_t *state,int is_chroma)

{
  int iVar1;
  double *pdVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar3 = equation_system_solve(&state->eqns);
  state->ar_gain = 1.0;
  if (iVar3 != 0) {
    iVar1 = (state->eqns).n;
    uVar4 = iVar1 - is_chroma;
    if (uVar4 == 0 || iVar1 < is_chroma) {
      dVar9 = 0.0;
      dVar8 = 0.0 / (double)(int)uVar4;
    }
    else {
      dVar8 = 0.0;
      iVar5 = 0;
      uVar6 = (ulong)uVar4;
      do {
        dVar8 = dVar8 + (state->eqns).A[iVar5] / (double)state->num_observations;
        iVar5 = iVar5 + iVar1 + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      dVar8 = dVar8 / (double)(int)uVar4;
      if ((int)uVar4 < 1) {
        dVar9 = 0.0;
      }
      else {
        pdVar2 = (state->eqns).x;
        dVar9 = 0.0;
        uVar6 = 0;
        lVar7 = (long)(iVar1 + -1);
        do {
          dVar10 = (state->eqns).b[uVar6];
          if (is_chroma != 0) {
            dVar10 = dVar10 - (state->eqns).A[lVar7] * pdVar2[iVar1 + -1];
          }
          dVar9 = dVar9 + (dVar10 * pdVar2[uVar6]) / (double)state->num_observations;
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + iVar1;
        } while (uVar4 != uVar6);
      }
    }
    dVar9 = dVar8 - dVar9;
    if (dVar9 <= 1e-06) {
      dVar9 = 1e-06;
    }
    dVar8 = dVar8 / dVar9;
    if (dVar8 <= 1e-06) {
      dVar8 = 1e-06;
    }
    dVar9 = 1.0;
    if (1.0 <= SQRT(dVar8)) {
      dVar9 = SQRT(dVar8);
    }
    state->ar_gain = dVar9;
  }
  return iVar3;
}

Assistant:

static int ar_equation_system_solve(aom_noise_state_t *state, int is_chroma) {
  const int ret = equation_system_solve(&state->eqns);
  state->ar_gain = 1.0;
  if (!ret) return ret;

  // Update the AR gain from the equation system as it will be used to fit
  // the noise strength as a function of intensity.  In the Yule-Walker
  // equations, the diagonal should be the variance of the correlated noise.
  // In the case of the least squares estimate, there will be some variability
  // in the diagonal. So use the mean of the diagonal as the estimate of
  // overall variance (this works for least squares or Yule-Walker formulation).
  double var = 0;
  const int n = state->eqns.n;
  for (int i = 0; i < (state->eqns.n - is_chroma); ++i) {
    var += state->eqns.A[i * n + i] / state->num_observations;
  }
  var /= (n - is_chroma);

  // Keep track of E(Y^2) = <b, x> + E(X^2)
  // In the case that we are using chroma and have an estimate of correlation
  // with luma we adjust that estimate slightly to remove the correlated bits by
  // subtracting out the last column of a scaled by our correlation estimate
  // from b. E(y^2) = <b - A(:, end)*x(end), x>
  double sum_covar = 0;
  for (int i = 0; i < state->eqns.n - is_chroma; ++i) {
    double bi = state->eqns.b[i];
    if (is_chroma) {
      bi -= state->eqns.A[i * n + (n - 1)] * state->eqns.x[n - 1];
    }
    sum_covar += (bi * state->eqns.x[i]) / state->num_observations;
  }
  // Now, get an estimate of the variance of uncorrelated noise signal and use
  // it to determine the gain of the AR filter.
  const double noise_var = AOMMAX(var - sum_covar, 1e-6);
  state->ar_gain = AOMMAX(1, sqrt(AOMMAX(var / noise_var, 1e-6)));
  return ret;
}